

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lts.c
# Opt level: O2

int lts_apply(char *in_word,char *feats,cst_lts_rules *r,lex_entry_t *out_phones)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  cst_lts_model *pcVar4;
  char cVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  char *__s;
  size_t sVar9;
  char **ppcVar10;
  acmod_id_t *paVar11;
  char *__s_00;
  char *__s_01;
  long lVar12;
  __int32_t **pp_Var13;
  ulong uVar14;
  long lVar15;
  char *__s_02;
  size_t sVar16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  uint32 uVar20;
  char zeros [8];
  
  __s = __ckd_salloc__(in_word,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                       ,0x6e);
  if (r->letter_table == (char **)0x0) {
    for (uVar14 = 0; sVar9 = strlen(__s), uVar14 < sVar9; uVar14 = uVar14 + 1) {
      pp_Var13 = __ctype_tolower_loc();
      __s[uVar14] = (char)(*pp_Var13)[__s[uVar14]];
    }
  }
  sVar9 = strlen(__s);
  uVar7 = (int)sVar9 + 10;
  ppcVar10 = (char **)__ckd_malloc__((long)(int)uVar7 * 8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                     ,0x75);
  out_phones->phone = ppcVar10;
  paVar11 = (acmod_id_t *)
            __ckd_malloc__((long)(int)uVar7 << 2,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                           ,0x76);
  out_phones->ci_acmod_id = paVar11;
  out_phones->phone_cnt = 0;
  __s_00 = (char *)__ckd_calloc__((long)r->context_extra_feats + (long)r->context_window_size * 2,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                  ,0x7b);
  iVar8 = r->context_window_size;
  sVar9 = strlen(__s);
  __s_01 = (char *)__ckd_calloc__(sVar9 + (long)iVar8 * 2 + 1,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                  ,0x7e);
  if (r->letter_table == (char **)0x0) {
    uVar19 = r->context_window_size - 1;
    sprintf(__s_01,"%.*s#%s#%.*s",(ulong)uVar19,"00000000",__s,(ulong)uVar19,"00000000");
    cVar5 = '#';
  }
  else {
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
      zeros[lVar12] = '\x02';
    }
    cVar5 = '\x01';
    sprintf(__s_01,"%.*s%c%s%c%.*s");
  }
  lVar12 = (long)r->context_window_size;
  do {
    if (cVar5 == __s_01[lVar12]) {
      ckd_free(__s_01);
      ckd_free(__s_00);
      ckd_free(__s);
      return 0;
    }
    pbVar1 = (byte *)(__s_01 + lVar12);
    uVar19 = r->context_window_size;
    sprintf(__s_00,"%.*s%.*s%s",(long)(int)uVar19,(long)pbVar1 - (long)(int)uVar19,(ulong)uVar19,
            pbVar1 + 1,feats);
    bVar2 = *pbVar1;
    if (r->letter_table == (char **)0x0) {
      if (0xe5 < (byte)(bVar2 + 0x85)) {
        uVar14 = (ulong)(bVar2 + 0xff9f & 0xffff);
        goto LAB_00111590;
      }
    }
    else {
      uVar14 = (ulong)bVar2 - 3;
LAB_00111590:
      pcVar4 = r->models;
      uVar6 = r->letter_index[uVar14];
      while( true ) {
        lVar15 = (ulong)uVar6 * 6;
        bVar2 = pcVar4[lVar15 + 1];
        if ((ulong)pcVar4[lVar15] == 0xff) break;
        uVar6 = *(ushort *)(pcVar4 + (ulong)(__s_00[pcVar4[lVar15]] != bVar2) * 2 + lVar15 + 2);
      }
      pcVar18 = r->phone_table[bVar2];
      iVar8 = strcmp("epsilon",pcVar18);
      if (iVar8 != 0) {
        if (uVar7 < out_phones->phone_cnt + 2) {
          lVar15 = (long)(int)uVar7;
          uVar7 = uVar7 + 10;
          ppcVar10 = (char **)__ckd_realloc__(out_phones->phone,lVar15 * 8 + 0x50,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                              ,0xa9);
          out_phones->phone = ppcVar10;
          paVar11 = (acmod_id_t *)
                    __ckd_realloc__(out_phones->ci_acmod_id,lVar15 * 4 + 0x28,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                    ,0xac);
          out_phones->ci_acmod_id = paVar11;
          pcVar18 = r->phone_table[bVar2];
        }
        __s_02 = strchr(pcVar18,0x2d);
        if (__s_02 == (char *)0x0) {
          pcVar18 = __ckd_salloc__(pcVar18,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                   ,0xb9);
          uVar19 = out_phones->phone_cnt;
          uVar20 = uVar19 + 1;
        }
        else {
          sVar9 = strlen(pcVar18);
          sVar16 = strlen(__s_02);
          pcVar17 = cst_substr(pcVar18,0,(int)sVar9 - (int)sVar16);
          pcVar18 = r->phone_table[bVar2];
          sVar9 = strlen(pcVar18);
          sVar16 = strlen(__s_02);
          pcVar18 = cst_substr(pcVar18,((int)sVar9 - (int)sVar16) + 1,(int)sVar16 + -1);
          uVar3 = out_phones->phone_cnt;
          uVar19 = uVar3 + 1;
          out_phones->phone[uVar3] = pcVar17;
          uVar20 = uVar3 + 2;
        }
        out_phones->phone_cnt = uVar20;
        out_phones->phone[uVar19] = pcVar18;
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

int
lts_apply(const char *in_word, const char *feats,
          const cst_lts_rules * r, lex_entry_t * out_phones)
{
    int pos, index, i, maxphones;
    cst_lts_letter *fval_buff;
    cst_lts_letter *full_buff;
    cst_lts_phone phone;
    char *left, *right, *p;
    char hash;
    char zeros[8];
    char *word;

    /* Downcase the incoming word unless we are a non-roman alphabet. */
    word = ckd_salloc((char *) in_word);
    if (!r->letter_table)
        for (i = 0; i < strlen(word); ++i)
            word[i] = tolower(word[i]);

    /* Fill in out_phones structure as best we can. */
    maxphones = strlen(word) + 10;
    out_phones->phone = ckd_malloc(maxphones * sizeof(char *));
    out_phones->ci_acmod_id = ckd_malloc(maxphones * sizeof(acmod_id_t));
    out_phones->phone_cnt = 0;

    /* For feature vals for each letter */
    fval_buff = ckd_calloc((r->context_window_size * 2) +
                           r->context_extra_feats, sizeof(cst_lts_letter));
    /* Buffer with added contexts */
    full_buff = ckd_calloc((r->context_window_size * 2) +       /* TBD assumes single POS feat */
                           strlen(word) + 1, sizeof(cst_lts_letter));
    if (r->letter_table) {
        for (i = 0; i < 8; i++)
            zeros[i] = 2;
        sprintf((char *)full_buff, "%.*s%c%s%c%.*s",
                r->context_window_size - 1, zeros,
                1, word, 1, r->context_window_size - 1, zeros);
        hash = 1;
    }
    else {
        /* Assumes l_letter is a char and context < 8 */
        sprintf((char *)full_buff, "%.*s#%s#%.*s",
                r->context_window_size - 1, "00000000",
                word, r->context_window_size - 1, "00000000");
        hash = '#';
    }

    /* Do the prediction forwards (begone, foul LISP!) */
    for (pos = r->context_window_size; full_buff[pos] != hash; ++pos) {
        /* Fill the features buffer for the predictor */
        sprintf((char *)fval_buff, "%.*s%.*s%s",
                r->context_window_size,
                full_buff + pos - r->context_window_size,
                r->context_window_size, full_buff + pos + 1, feats);
        if ((!r->letter_table
             && ((full_buff[pos] < 'a') || (full_buff[pos] > 'z')))) {
#ifdef EXCESSIVELY_CHATTY
            E_WARN("lts:skipping unknown char \"%c\"\n", full_buff[pos]);
#endif
            continue;
        }
        if (r->letter_table)
            index = full_buff[pos] - 3;
        else
            index = (full_buff[pos] - 'a') % 26;
        phone = apply_model(fval_buff, r->letter_index[index], r->models);
        /* delete epsilons and split dual-phones */
        if (0 == strcmp("epsilon", r->phone_table[phone]))
            continue;
        /* dynamically grow out_phones if necessary. */
        if (out_phones->phone_cnt + 2 > maxphones) {
            maxphones += 10;
            out_phones->phone = ckd_realloc(out_phones->phone,
                                            maxphones * sizeof(char *));
            out_phones->ci_acmod_id = ckd_realloc(out_phones->ci_acmod_id,
                                                  maxphones *
                                                  sizeof(acmod_id_t));
        }
        if ((p = strchr(r->phone_table[phone], '-')) != NULL) {
            left = cst_substr(r->phone_table[phone], 0,
                              strlen(r->phone_table[phone]) - strlen(p));
            right = cst_substr(r->phone_table[phone],
                               (strlen(r->phone_table[phone]) -
                                strlen(p)) + 1, (strlen(p) - 1));
            out_phones->phone[out_phones->phone_cnt++] = left;
            out_phones->phone[out_phones->phone_cnt++] = right;
        }
        else
            out_phones->phone[out_phones->phone_cnt++] =
                ckd_salloc((char *) r->phone_table[phone]);
    }


    ckd_free(full_buff);
    ckd_free(fval_buff);
    ckd_free(word);
    return S3_SUCCESS;
}